

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
          (optional<tinyusdz::Interpolation> *this,optional<tinyusdz::Interpolation> *other)

{
  storage_t<tinyusdz::Interpolation> *psVar1;
  value_type *value;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      this->has_value_ = false;
    }
    else {
      psVar1 = (storage_t<tinyusdz::Interpolation> *)operator*(other);
      this->contained = *psVar1;
    }
  }
  else if (other->has_value_ != false) {
    value = operator*(other);
    initialize<tinyusdz::Interpolation>(this,value);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }